

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdTable.cpp
# Opt level: O2

void __thiscall IdTable::IdTable(IdTable *this)

{
  int local_1c;
  
  (this->table).super__Vector_base<Id_*,_std::allocator<Id_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->table).super__Vector_base<Id_*,_std::allocator<Id_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->table).super__Vector_base<Id_*,_std::allocator<Id_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(&this->index);
  local_1c = 0;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&(this->index).c,&local_1c);
  return;
}

Assistant:

IdTable::IdTable(){
  index.push(0);
}